

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void Utils::getDateFromPos(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int pos)

{
  longlong input;
  tm *__tp;
  char *pcVar1;
  tm *timeinfo;
  time_t rawtime;
  longlong local_20;
  longlong time_l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_10;
  int pos_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  
  time_l._4_4_ = pos;
  pvStack_10 = vec;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rawtime,vec);
  input = vectEightBytesToUnsignedInt
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rawtime,time_l._4_4_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&rawtime);
  local_20 = input;
  timeinfo = (tm *)convertWindowsTimeToUnixTime(input);
  __tp = localtime((time_t *)&timeinfo);
  pcVar1 = asctime(__tp);
  std::operator<<((ostream *)&std::cout,pcVar1);
  return;
}

Assistant:

void Utils::getDateFromPos(std::vector<unsigned int> vec, int pos) {
    long long int time_l = vectEightBytesToUnsignedInt(vec, pos);
    time_t rawtime = convertWindowsTimeToUnixTime(time_l);
    struct tm * timeinfo;

    timeinfo = localtime(&rawtime);
    cout << asctime(timeinfo);
}